

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::MenuItem(char *label,char *shortcut,bool selected,bool enabled)

{
  ImGuiContext *pIVar1;
  float flags_00;
  uint uVar2;
  ImU32 col;
  ImGuiWindow *pIVar3;
  ImVec2 local_ac;
  ImVec2 local_a4;
  ImVec2 local_9c;
  ImVec2 local_94;
  ImVec2 local_8c;
  ImVec2 local_84;
  float local_7c;
  float local_78;
  float extra_w;
  float w_1;
  ImVec2 shortcut_size;
  ImVec2 local_64;
  float local_5c;
  byte local_55;
  float w;
  float fStack_50;
  bool pressed;
  ImGuiSelectableFlags flags;
  ImVec2 label_size;
  ImVec2 pos;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  bool enabled_local;
  bool selected_local;
  char *shortcut_local;
  char *label_local;
  
  pIVar3 = GetCurrentWindow();
  pIVar1 = GImGui;
  if ((pIVar3->SkipItems & 1U) == 0) {
    label_size = (pIVar3->DC).CursorPos;
    _fStack_50 = CalcTextSize(label,(char *)0x0,true,-1.0);
    uVar2 = 8;
    if (enabled) {
      uVar2 = 0;
    }
    w = (float)(uVar2 | 0x400000);
    if ((pIVar3->DC).LayoutType == 0) {
      local_5c = fStack_50;
      (pIVar3->DC).CursorPos.x =
           (float)(int)((pIVar1->Style).ItemSpacing.x * 0.5) + (pIVar3->DC).CursorPos.x;
      ImVec2::ImVec2(&local_64,(pIVar1->Style).ItemSpacing.x * 2.0,(pIVar1->Style).ItemSpacing.y);
      PushStyleVar(0xd,&local_64);
      flags_00 = w;
      ImVec2::ImVec2(&shortcut_size,local_5c,0.0);
      local_55 = Selectable(label,false,(ImGuiSelectableFlags)flags_00,&shortcut_size);
      PopStyleVar(1);
      (pIVar3->DC).CursorPos.x =
           (float)(int)((pIVar1->Style).ItemSpacing.x * -0.5) + (pIVar3->DC).CursorPos.x;
    }
    else {
      if (shortcut == (char *)0x0) {
        ImVec2::ImVec2((ImVec2 *)&extra_w,0.0,0.0);
      }
      else {
        _extra_w = CalcTextSize(shortcut,(char *)0x0,false,-1.0);
      }
      local_78 = ImGuiMenuColumns::DeclColumns
                           (&pIVar3->MenuColumns,fStack_50,extra_w,
                            (float)(int)(pIVar1->FontSize * 1.2));
      local_84 = GetContentRegionAvail();
      local_7c = ImMax<float>(0.0,local_84.x - local_78);
      uVar2 = (uint)w | 0x800000;
      ImVec2::ImVec2(&local_8c,local_78,0.0);
      local_55 = Selectable(label,false,uVar2,&local_8c);
      if (0.0 < extra_w) {
        PushStyleColor(0,(pIVar1->Style).Colors + 1);
        ImVec2::ImVec2(&local_9c,(pIVar3->MenuColumns).Pos[1] + local_7c,0.0);
        local_94 = operator+(&label_size,&local_9c);
        RenderText(local_94,shortcut,(char *)0x0,false);
        PopStyleColor(1);
      }
      if (selected) {
        ImVec2::ImVec2(&local_ac,pIVar1->FontSize * 0.4 + (pIVar3->MenuColumns).Pos[2] + local_7c,
                       pIVar1->FontSize * 0.134 * 0.5);
        local_a4 = operator+(&label_size,&local_ac);
        col = GetColorU32((byte)~enabled & 1,1.0);
        RenderCheckMark(local_a4,col,pIVar1->FontSize * 0.866);
      }
    }
    label_local._7_1_ = (bool)(local_55 & 1);
  }
  else {
    label_local._7_1_ = false;
  }
  return label_local._7_1_;
}

Assistant:

bool ImGui::MenuItem(const char* label, const char* shortcut, bool selected, bool enabled)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;
    ImVec2 pos = window->DC.CursorPos;
    ImVec2 label_size = CalcTextSize(label, NULL, true);

    ImGuiSelectableFlags flags = ImGuiSelectableFlags_PressedOnRelease | (enabled ? 0 : ImGuiSelectableFlags_Disabled);
    bool pressed;
    if (window->DC.LayoutType == ImGuiLayoutType_Horizontal)
    {
        // Mimic the exact layout spacing of BeginMenu() to allow MenuItem() inside a menu bar, which is a little misleading but may be useful
        // Note that in this situation we render neither the shortcut neither the selected tick mark
        float w = label_size.x;
        window->DC.CursorPos.x += (float)(int)(style.ItemSpacing.x * 0.5f);
        PushStyleVar(ImGuiStyleVar_ItemSpacing, ImVec2(style.ItemSpacing.x * 2.0f, style.ItemSpacing.y));
        pressed = Selectable(label, false, flags, ImVec2(w, 0.0f));
        PopStyleVar();
        window->DC.CursorPos.x += (float)(int)(style.ItemSpacing.x * (-1.0f + 0.5f)); // -1 spacing to compensate the spacing added when Selectable() did a SameLine(). It would also work to call SameLine() ourselves after the PopStyleVar().
    }
    else
    {
        ImVec2 shortcut_size = shortcut ? CalcTextSize(shortcut, NULL) : ImVec2(0.0f, 0.0f);
        float w = window->MenuColumns.DeclColumns(label_size.x, shortcut_size.x, (float)(int)(g.FontSize * 1.20f)); // Feedback for next frame
        float extra_w = ImMax(0.0f, GetContentRegionAvail().x - w);
        pressed = Selectable(label, false, flags | ImGuiSelectableFlags_DrawFillAvailWidth, ImVec2(w, 0.0f));
        if (shortcut_size.x > 0.0f)
        {
            PushStyleColor(ImGuiCol_Text, g.Style.Colors[ImGuiCol_TextDisabled]);
            RenderText(pos + ImVec2(window->MenuColumns.Pos[1] + extra_w, 0.0f), shortcut, NULL, false);
            PopStyleColor();
        }
        if (selected)
            RenderCheckMark(pos + ImVec2(window->MenuColumns.Pos[2] + extra_w + g.FontSize * 0.40f, g.FontSize * 0.134f * 0.5f), GetColorU32(enabled ? ImGuiCol_Text : ImGuiCol_TextDisabled), g.FontSize  * 0.866f);
    }

    IMGUI_TEST_ENGINE_ITEM_INFO(window->DC.LastItemId, label, window->DC.ItemFlags | ImGuiItemStatusFlags_Checkable | (selected ? ImGuiItemStatusFlags_Checked : 0));
    return pressed;
}